

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O1

void __thiscall
EnvironmentROBARM::PrintState(EnvironmentROBARM *this,int stateID,bool bVerbose,FILE *fOut)

{
  undefined7 in_register_00000011;
  
  if (fOut == (FILE *)0x0) {
    fOut = _stdout;
  }
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x26])
            (this,fOut,
             (this->EnvROBARM).StateID2CoordTable.
             super__Vector_base<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>._M_impl
             .super__Vector_impl_data._M_start[stateID]->coord,
             (ulong)(((this->EnvROBARM).goalHashEntry)->stateID == stateID),
             CONCAT71(in_register_00000011,bVerbose) & 0xffffffff,0);
  return;
}

Assistant:

void EnvironmentROBARM::PrintState(int stateID, bool bVerbose, FILE* fOut /*=NULL*/)
{

#if DEBUG
    if(stateID >= (int)EnvROBARM.StateID2CoordTable.size())
    {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal (2)");
    }
#endif

    if (fOut == NULL) fOut = stdout;

    EnvROBARMHashEntry_t* HashEntry = EnvROBARM.StateID2CoordTable[stateID];

    bool bGoal = false;
    if (stateID == EnvROBARM.goalHashEntry->stateID) bGoal = true;

    if (stateID == EnvROBARM.goalHashEntry->stateID && bVerbose) {
        SBPL_FPRINTF(fOut, "the state is a goal state\n");
        bGoal = true;
    }

    printangles(fOut, HashEntry->coord, bGoal, bVerbose, false);
}